

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void check_repfnz(int n,int w,int jcol,int *repfnz)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  char msg [256];
  char acStack_108 [256];
  
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  lVar2 = (long)jcol;
  do {
    if (w + jcol <= lVar2) {
      return;
    }
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      if (repfnz[uVar1] != -1) {
        fprintf(_stderr,"col %d, repfnz_col[%d] = %d\n",lVar2,uVar1 & 0xffffffff);
        sprintf(acStack_108,"%s at line %d in file %s\n","check_repfnz",0x218,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/util.c");
        superlu_abort_and_exit(acStack_108);
      }
    }
    lVar2 = lVar2 + 1;
    repfnz = repfnz + n;
  } while( true );
}

Assistant:

void check_repfnz(int n, int w, int jcol, const int *repfnz)
{
    int jj, k;

    for (jj = jcol; jj < jcol+w; jj++) 
	for (k = 0; k < n; k++)
	    if ( repfnz[(jj-jcol)*n + k] != SLU_EMPTY ) {
		fprintf(stderr, "col %d, repfnz_col[%d] = %d\n", jj,
			k, repfnz[(jj-jcol)*n + k]);
		ABORT("check_repfnz");
	    }
}